

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O3

int amqp_encode_properties(uint16_t class_id,void *decoded,amqp_bytes_t encoded)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  size_t o;
  ulong uVar9;
  ulong uVar10;
  ulong local_30;
  
  pvVar5 = encoded.bytes;
  uVar8 = encoded.len;
  uVar1 = *decoded;
  uVar10 = 1;
  uVar7 = uVar1;
  do {
    uVar6 = uVar10;
    if (uVar8 < uVar6 + 1) {
      return -2;
    }
    uVar10 = uVar6 + 2;
    *(ushort *)((long)pvVar5 + (uVar6 - 1)) =
         ((ushort)(0xffff < uVar7) | (ushort)uVar7 & 0xfffe) << 8 | (ushort)uVar7 >> 8;
    bVar3 = 0xffff < uVar7;
    uVar7 = uVar7 >> 0x10;
  } while (bVar3);
  if (class_id < 0x32) {
    if (class_id < 0x1e) {
      if ((class_id != 10) && (class_id != 0x14)) {
        return -3;
      }
    }
    else if ((class_id != 0x1e) && (class_id != 0x28)) {
      return -3;
    }
  }
  else if (class_id < 0x55) {
    if (class_id != 0x32) {
      if (class_id != 0x3c) {
        return -3;
      }
      uVar9 = uVar6 + 1;
      local_30 = uVar6 + 1;
      if ((short)uVar1 < 0) {
        if (0xff < *(ulong *)((long)decoded + 8)) {
          return -2;
        }
        if (uVar8 < uVar10) {
          return -2;
        }
        *(char *)((long)pvVar5 + uVar6 + 1) = (char)*(ulong *)((long)decoded + 8);
        sVar2 = *(size_t *)((long)decoded + 8);
        uVar9 = uVar10;
        local_30 = uVar10;
        if (sVar2 != 0) {
          uVar9 = sVar2 + uVar10;
          if (uVar8 < uVar9) {
            return -2;
          }
          local_30 = uVar9;
          memcpy((void *)(uVar10 + (long)pvVar5),*(void **)((long)decoded + 0x10),sVar2);
        }
      }
      if ((uVar1 >> 0xe & 1) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0x18)) {
          return -2;
        }
        uVar10 = uVar9 + 1;
        if (uVar8 < uVar10) {
          return -2;
        }
        *(char *)((long)pvVar5 + uVar9) = (char)*(ulong *)((long)decoded + 0x18);
        sVar2 = *(size_t *)((long)decoded + 0x18);
        local_30 = uVar10;
        if (sVar2 != 0) {
          local_30 = sVar2 + uVar10;
          if (uVar8 < local_30) {
            return -2;
          }
          memcpy((void *)(uVar10 + (long)pvVar5),*(void **)((long)decoded + 0x20),sVar2);
        }
      }
      if (((uVar1 >> 0xd & 1) != 0) &&
         (iVar4 = amqp_encode_table(encoded,(amqp_table_t *)((long)decoded + 0x28),&local_30),
         iVar4 < 0)) {
        return iVar4;
      }
      if ((uVar1 >> 0xc & 1) != 0) {
        if (uVar8 < local_30 + 1) {
          return -2;
        }
        *(undefined1 *)((long)pvVar5 + local_30) = *(undefined1 *)((long)decoded + 0x38);
        local_30 = local_30 + 1;
      }
      if ((uVar1 >> 0xb & 1) != 0) {
        if (uVar8 < local_30 + 1) {
          return -2;
        }
        *(undefined1 *)((long)pvVar5 + local_30) = *(undefined1 *)((long)decoded + 0x39);
        local_30 = local_30 + 1;
      }
      if ((uVar1 >> 10 & 1) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0x40)) {
          return -2;
        }
        uVar10 = local_30 + 1;
        if (uVar8 < uVar10) {
          return -2;
        }
        *(char *)((long)pvVar5 + local_30) = (char)*(ulong *)((long)decoded + 0x40);
        sVar2 = *(size_t *)((long)decoded + 0x40);
        local_30 = uVar10;
        if (sVar2 != 0) {
          local_30 = sVar2 + uVar10;
          if (uVar8 < local_30) {
            return -2;
          }
          memcpy((void *)(uVar10 + (long)pvVar5),*(void **)((long)decoded + 0x48),sVar2);
        }
      }
      if ((uVar1 >> 9 & 1) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0x50)) {
          return -2;
        }
        uVar10 = local_30 + 1;
        if (uVar8 < uVar10) {
          return -2;
        }
        *(char *)((long)pvVar5 + local_30) = (char)*(ulong *)((long)decoded + 0x50);
        sVar2 = *(size_t *)((long)decoded + 0x50);
        local_30 = uVar10;
        if (sVar2 != 0) {
          local_30 = sVar2 + uVar10;
          if (uVar8 < local_30) {
            return -2;
          }
          memcpy((void *)(uVar10 + (long)pvVar5),*(void **)((long)decoded + 0x58),sVar2);
        }
      }
      if ((uVar1 >> 8 & 1) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0x60)) {
          return -2;
        }
        uVar10 = local_30 + 1;
        if (uVar8 < uVar10) {
          return -2;
        }
        *(char *)((long)pvVar5 + local_30) = (char)*(ulong *)((long)decoded + 0x60);
        sVar2 = *(size_t *)((long)decoded + 0x60);
        local_30 = uVar10;
        if (sVar2 != 0) {
          local_30 = sVar2 + uVar10;
          if (uVar8 < local_30) {
            return -2;
          }
          memcpy((void *)(uVar10 + (long)pvVar5),*(void **)((long)decoded + 0x68),sVar2);
        }
      }
      if ((char)uVar1 < '\0') {
        if (0xff < *(ulong *)((long)decoded + 0x70)) {
          return -2;
        }
        uVar10 = local_30 + 1;
        if (uVar8 < uVar10) {
          return -2;
        }
        *(char *)((long)pvVar5 + local_30) = (char)*(ulong *)((long)decoded + 0x70);
        sVar2 = *(size_t *)((long)decoded + 0x70);
        local_30 = uVar10;
        if (sVar2 != 0) {
          local_30 = sVar2 + uVar10;
          if (uVar8 < local_30) {
            return -2;
          }
          memcpy((void *)(uVar10 + (long)pvVar5),*(void **)((long)decoded + 0x78),sVar2);
        }
      }
      if ((uVar1 & 0x40) != 0) {
        uVar10 = *(ulong *)((long)decoded + 0x80);
        if (uVar8 < local_30 + 8) {
          return -2;
        }
        *(ulong *)((long)pvVar5 + local_30) =
             uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
             (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
             (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28 |
             uVar10 << 0x38;
        local_30 = local_30 + 8;
      }
      if ((uVar1 & 0x20) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0x88)) {
          return -2;
        }
        uVar10 = local_30 + 1;
        if (uVar8 < uVar10) {
          return -2;
        }
        *(char *)((long)pvVar5 + local_30) = (char)*(ulong *)((long)decoded + 0x88);
        sVar2 = *(size_t *)((long)decoded + 0x88);
        local_30 = uVar10;
        if (sVar2 != 0) {
          local_30 = sVar2 + uVar10;
          if (uVar8 < local_30) {
            return -2;
          }
          memcpy((void *)(uVar10 + (long)pvVar5),*(void **)((long)decoded + 0x90),sVar2);
        }
      }
      if ((uVar1 & 0x10) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0x98)) {
          return -2;
        }
        uVar10 = local_30 + 1;
        if (uVar8 < uVar10) {
          return -2;
        }
        *(char *)((long)pvVar5 + local_30) = (char)*(ulong *)((long)decoded + 0x98);
        sVar2 = *(size_t *)((long)decoded + 0x98);
        local_30 = uVar10;
        if (sVar2 != 0) {
          local_30 = sVar2 + uVar10;
          if (uVar8 < local_30) {
            return -2;
          }
          memcpy((void *)(uVar10 + (long)pvVar5),*(void **)((long)decoded + 0xa0),sVar2);
        }
      }
      if ((uVar1 & 8) != 0) {
        if (0xff < *(ulong *)((long)decoded + 0xa8)) {
          return -2;
        }
        uVar10 = local_30 + 1;
        if (uVar8 < uVar10) {
          return -2;
        }
        *(char *)((long)pvVar5 + local_30) = (char)*(ulong *)((long)decoded + 0xa8);
        sVar2 = *(size_t *)((long)decoded + 0xa8);
        local_30 = uVar10;
        if (sVar2 != 0) {
          local_30 = sVar2 + uVar10;
          if (uVar8 < local_30) {
            return -2;
          }
          memcpy((void *)(uVar10 + (long)pvVar5),*(void **)((long)decoded + 0xb0),sVar2);
        }
      }
      uVar10 = local_30;
      if ((uVar1 & 4) != 0) {
        if ((0xff < *(ulong *)((long)decoded + 0xb8)) || (uVar10 = local_30 + 1, uVar8 < uVar10)) {
          return -2;
        }
        *(char *)((long)pvVar5 + local_30) = (char)*(ulong *)((long)decoded + 0xb8);
        sVar2 = *(size_t *)((long)decoded + 0xb8);
        if (sVar2 != 0) {
          uVar6 = sVar2 + uVar10;
          if (uVar8 < uVar6) {
            return -2;
          }
          local_30 = uVar6;
          memcpy((void *)((long)pvVar5 + uVar10),*(void **)((long)decoded + 0xc0),sVar2);
          uVar10 = uVar6;
        }
      }
      return (int)uVar10;
    }
  }
  else if ((class_id != 0x55) && (class_id != 0x5a)) {
    return -3;
  }
  return (int)uVar10 + -1;
}

Assistant:

int amqp_encode_properties(uint16_t class_id, void *decoded,
                           amqp_bytes_t encoded) {
  size_t offset = 0;

  /* Cheat, and get the flags out generically, relying on the
     similarity of structure between classes */
  amqp_flags_t flags = *(amqp_flags_t *)decoded; /* cheating! */

  {
    /* We take a copy of flags to avoid destroying it, as it is used
       in the autogenerated code below. */
    amqp_flags_t remaining_flags = flags;
    do {
      amqp_flags_t remainder = remaining_flags >> 16;
      uint16_t partial_flags = remaining_flags & 0xFFFE;
      if (remainder != 0) {
        partial_flags |= 1;
      }
      if (!amqp_encode_16(encoded, &offset, partial_flags))
        return AMQP_STATUS_BAD_AMQP_DATA;
      remaining_flags = remainder;
    } while (remaining_flags != 0);
  }

  switch (class_id) {
    case 10: {
      return (int)offset;
    }
    case 20: {
      return (int)offset;
    }
    case 30: {
      return (int)offset;
    }
    case 40: {
      return (int)offset;
    }
    case 50: {
      return (int)offset;
    }
    case 60: {
      amqp_basic_properties_t *p = (amqp_basic_properties_t *)decoded;
      if (flags & AMQP_BASIC_CONTENT_TYPE_FLAG) {
        if (UINT8_MAX < p->content_type.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->content_type.len) ||
            !amqp_encode_bytes(encoded, &offset, p->content_type))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_CONTENT_ENCODING_FLAG) {
        if (UINT8_MAX < p->content_encoding.len ||
            !amqp_encode_8(encoded, &offset,
                           (uint8_t)p->content_encoding.len) ||
            !amqp_encode_bytes(encoded, &offset, p->content_encoding))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_HEADERS_FLAG) {
        {
          int res = amqp_encode_table(encoded, &(p->headers), &offset);
          if (res < 0) return res;
        }
      }
      if (flags & AMQP_BASIC_DELIVERY_MODE_FLAG) {
        if (!amqp_encode_8(encoded, &offset, p->delivery_mode))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_PRIORITY_FLAG) {
        if (!amqp_encode_8(encoded, &offset, p->priority))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_CORRELATION_ID_FLAG) {
        if (UINT8_MAX < p->correlation_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->correlation_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->correlation_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_REPLY_TO_FLAG) {
        if (UINT8_MAX < p->reply_to.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->reply_to.len) ||
            !amqp_encode_bytes(encoded, &offset, p->reply_to))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_EXPIRATION_FLAG) {
        if (UINT8_MAX < p->expiration.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->expiration.len) ||
            !amqp_encode_bytes(encoded, &offset, p->expiration))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_MESSAGE_ID_FLAG) {
        if (UINT8_MAX < p->message_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->message_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->message_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_TIMESTAMP_FLAG) {
        if (!amqp_encode_64(encoded, &offset, p->timestamp))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_TYPE_FLAG) {
        if (UINT8_MAX < p->type.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->type.len) ||
            !amqp_encode_bytes(encoded, &offset, p->type))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_USER_ID_FLAG) {
        if (UINT8_MAX < p->user_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->user_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->user_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_APP_ID_FLAG) {
        if (UINT8_MAX < p->app_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->app_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->app_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_CLUSTER_ID_FLAG) {
        if (UINT8_MAX < p->cluster_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->cluster_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->cluster_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      return (int)offset;
    }
    case 90: {
      return (int)offset;
    }
    case 85: {
      return (int)offset;
    }
    default:
      return AMQP_STATUS_UNKNOWN_CLASS;
  }
}